

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btScalar.h
# Opt level: O2

btScalar btAtan2Fast(btScalar y,btScalar x)

{
  float fVar1;
  
  fVar1 = ABS(y);
  if (0.0 <= x) {
    fVar1 = ((x - fVar1) / (fVar1 + x)) * -0.7853982 + 0.7853982;
  }
  else {
    fVar1 = ((fVar1 + x) / (fVar1 - x)) * -0.7853982 + 2.3561945;
  }
  return (btScalar)(~-(uint)(y < 0.0) & (uint)fVar1 | (uint)-fVar1 & -(uint)(y < 0.0));
}

Assistant:

SIMD_FORCE_INLINE btScalar btAtan2Fast(btScalar y, btScalar x) 
{
	btScalar coeff_1 = SIMD_PI / 4.0f;
	btScalar coeff_2 = 3.0f * coeff_1;
	btScalar abs_y = btFabs(y);
	btScalar angle;
	if (x >= 0.0f) {
		btScalar r = (x - abs_y) / (x + abs_y);
		angle = coeff_1 - coeff_1 * r;
	} else {
		btScalar r = (x + abs_y) / (abs_y - x);
		angle = coeff_2 - coeff_1 * r;
	}
	return (y < 0.0f) ? -angle : angle;
}